

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterJoinThread(SortSubtask *pTask)

{
  long lVar1;
  SQLiteThread *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  int rc;
  void *pRet;
  uint in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_RDI->tid != 0;
  if (bVar2) {
    sqlite3ThreadJoin(in_RDI,(void **)(ulong)in_stack_ffffffffffffffe0);
    in_RDI->done = 0;
    in_RDI->tid = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeSorterJoinThread(SortSubtask *pTask){
  int rc = SQLITE_OK;
  if( pTask->pThread ){
#ifdef SQLITE_DEBUG_SORTER_THREADS
    int bDone = pTask->bDone;
#endif
    void *pRet = SQLITE_INT_TO_PTR(SQLITE_ERROR);
    vdbeSorterBlockDebug(pTask, !bDone, "enter");
    (void)sqlite3ThreadJoin(pTask->pThread, &pRet);
    vdbeSorterBlockDebug(pTask, !bDone, "exit");
    rc = SQLITE_PTR_TO_INT(pRet);
    assert( pTask->bDone==1 );
    pTask->bDone = 0;
    pTask->pThread = 0;
  }
  return rc;
}